

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

void __thiscall dxil_spv::SPIRVModule::Impl::build_discard_call_exit(Impl *this)

{
  Id IVar1;
  Function *pFVar2;
  Block *pBVar3;
  size_t sVar4;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_90;
  undefined4 local_74;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_70;
  Id local_64;
  Block *pBStack_60;
  Id loaded_state;
  Block *false_block;
  Block *true_block;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_38;
  Block *local_20;
  Block *entry;
  Block *current_build_point;
  Impl *this_local;
  
  current_build_point = (Block *)this;
  entry = spv::Builder::getBuildPoint(&this->builder);
  if (this->discard_function == (Function *)0x0) {
    local_20 = (Block *)0x0;
    IVar1 = spv::Builder::makeVoidType(&this->builder);
    memset(&local_38,0,0x18);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector(&local_38);
    memset(&true_block,0,0x18);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              *)&true_block);
    sVar4 = 0x7fffffff;
    pFVar2 = spv::Builder::makeFunctionEntry
                       (&this->builder,DecorationMax,IVar1,"discard_exit",&local_38,
                        (Vector<dxil_spv::Vector<Decoration>_> *)&true_block,&local_20);
    this->discard_function = pFVar2;
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               *)&true_block);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_38);
    pBVar3 = (Block *)spv::Block::operator_new((Block *)0x78,sVar4);
    IVar1 = spv::Builder::getUniqueId(&this->builder);
    sVar4 = (size_t)IVar1;
    spv::Block::Block(pBVar3,IVar1,this->discard_function);
    false_block = pBVar3;
    pBVar3 = (Block *)spv::Block::operator_new((Block *)0x78,sVar4);
    IVar1 = spv::Builder::getUniqueId(&this->builder);
    spv::Block::Block(pBVar3,IVar1,this->discard_function);
    pBStack_60 = pBVar3;
    spv::Builder::setBuildPoint(&this->builder,local_20);
    local_64 = spv::Builder::createLoad(&this->builder,this->discard_state_var_id);
    spv::Builder::createSelectionMerge(&this->builder,pBStack_60,0);
    spv::Builder::createConditionalBranch(&this->builder,local_64,false_block,pBStack_60);
    pBVar3 = false_block;
    local_74 = 0xfc;
    std::make_unique<spv::Instruction,spv::Op>((Op *)&local_70);
    add_instruction(this,pBVar3,&local_70);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_70);
    spv::Builder::setBuildPoint(&this->builder,pBStack_60);
    spv::Builder::makeReturn(&this->builder,false,0);
  }
  spv::Builder::setBuildPoint(&this->builder,entry);
  pFVar2 = this->discard_function;
  memset(&local_90,0,0x18);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector(&local_90);
  spv::Builder::createFunctionCall(&this->builder,pFVar2,&local_90);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_90);
  return;
}

Assistant:

void SPIRVModule::Impl::build_discard_call_exit()
{
	auto *current_build_point = builder.getBuildPoint();

	if (!discard_function)
	{
		spv::Block *entry = nullptr;
		discard_function =
		    builder.makeFunctionEntry(spv::NoPrecision, builder.makeVoidType(), "discard_exit", {}, {}, &entry);

		auto *true_block = new spv::Block(builder.getUniqueId(), *discard_function);
		auto *false_block = new spv::Block(builder.getUniqueId(), *discard_function);

		builder.setBuildPoint(entry);
		spv::Id loaded_state = builder.createLoad(discard_state_var_id);
		builder.createSelectionMerge(false_block, 0);
		builder.createConditionalBranch(loaded_state, true_block, false_block);
		add_instruction(true_block, std::make_unique<spv::Instruction>(spv::OpKill));
		builder.setBuildPoint(false_block);
		builder.makeReturn(false);
	}

	builder.setBuildPoint(current_build_point);
	builder.createFunctionCall(discard_function, {});
}